

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3ExprAnd(Parse *pParse,Expr *pLeft,Expr *pRight)

{
  sqlite3 *db;
  Expr *pEVar1;
  Token local_30;
  
  pEVar1 = pRight;
  if ((pLeft != (Expr *)0x0) && (pEVar1 = pLeft, pRight != (Expr *)0x0)) {
    if ((((pRight->flags | pLeft->flags) & 0x20000003) != 0x20000000) || (1 < pParse->eParseMode)) {
      pEVar1 = sqlite3PExpr(pParse,0x2c,pLeft,pRight);
      return pEVar1;
    }
    db = pParse->db;
    sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pLeft);
    sqlite3ParserAddCleanup(pParse,sqlite3ExprDeleteGeneric,pRight);
    local_30.z = "0";
    local_30.n = 1;
    pEVar1 = sqlite3ExprAlloc(db,0x9b,&local_30,0);
  }
  return pEVar1;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3ExprAnd(Parse *pParse, Expr *pLeft, Expr *pRight){
  sqlite3 *db = pParse->db;
  if( pLeft==0  ){
    return pRight;
  }else if( pRight==0 ){
    return pLeft;
  }else{
    u32 f = pLeft->flags | pRight->flags;
    if( (f&(EP_OuterON|EP_InnerON|EP_IsFalse))==EP_IsFalse
     && !IN_RENAME_OBJECT
    ){
      sqlite3ExprDeferredDelete(pParse, pLeft);
      sqlite3ExprDeferredDelete(pParse, pRight);
      return sqlite3Expr(db, TK_INTEGER, "0");
    }else{
      return sqlite3PExpr(pParse, TK_AND, pLeft, pRight);
    }
  }
}